

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  bool bVar3;
  long lVar4;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  Stream local_78;
  socket_t local_70;
  time_t local_68;
  time_t tStack_60;
  time_t local_58;
  time_t tStack_50;
  void *local_48;
  long local_40;
  long local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_70 = socket->sock;
  local_68 = this->read_timeout_sec_;
  tStack_60 = this->read_timeout_usec_;
  local_58 = this->write_timeout_sec_;
  tStack_50 = this->write_timeout_usec_;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (_Manager_type)0x0;
  p_Var1 = callback->_M_invoker;
  p_Var2 = (callback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_98._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_98._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_88 = p_Var2;
  }
  local_78._vptr_Stream = (_func_int **)&PTR__SocketStream_0019cad8;
  local_80 = p_Var1;
  local_48 = operator_new(0x1000);
  lVar4 = (long)local_48 + 0x1000;
  local_38 = lVar4;
  memset(local_48,0,0x1000);
  local_30 = 0;
  uStack_28 = 0;
  local_40 = lVar4;
  if (p_Var2 != (_Manager_type)0x0) {
    bVar3 = (*p_Var1)(&local_98,&local_78);
    local_78._vptr_Stream = (_func_int **)&PTR__SocketStream_0019cad8;
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    if (local_88 != (_Manager_type)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
    return bVar3;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
ClientImpl::process_socket(const Socket &socket,
                           std::function<bool(Stream &strm)> callback) {
  return detail::process_client_socket(
      socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_, std::move(callback));
}